

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

int count_files(dir_tree_t *trees)

{
  int iVar1;
  file_entry_t *pfVar2;
  
  iVar1 = 0;
  for (; trees != (dir_tree_t *)0x0; trees = trees->next) {
    pfVar2 = (file_entry_t *)&trees->files;
    iVar1 = iVar1 + -1;
    do {
      pfVar2 = pfVar2->next;
      iVar1 = iVar1 + 1;
    } while (pfVar2 != (file_entry_t *)0x0);
  }
  return iVar1;
}

Assistant:

int count_files(dir_tree_t *trees)
{
	dir_tree_t *tree;
	file_entry_t *file;
	int count;

	for (count = 0, tree = trees; tree != NULL; tree = tree->next)
	{
		for (file = tree->files; file != NULL; file = file->next)
		{
			count++;
		}
	}
	return count;
}